

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O1

int callback_cancel(uint id)

{
  int pi;
  callback_t **ppcVar1;
  callback_t *__ptr;
  
  __ptr = gCallBackFirst;
  if (gCallBackFirst != (callback_t *)0x0) {
    do {
      if (__ptr->id == id) {
        pi = __ptr->pi;
        ppcVar1 = &gCallBackFirst;
        if (__ptr->prev != (callback_t *)0x0) {
          ppcVar1 = &__ptr->prev->next;
        }
        *ppcVar1 = __ptr->next;
        ppcVar1 = &gCallBackLast;
        if (__ptr->next != (callback_t *)0x0) {
          ppcVar1 = &__ptr->next->prev;
        }
        *ppcVar1 = __ptr->prev;
        free(__ptr);
        findNotifyBits(pi);
        return 0;
      }
      ppcVar1 = &__ptr->next;
      __ptr = *ppcVar1;
    } while (*ppcVar1 != (callback_t *)0x0);
  }
  return -0x7da;
}

Assistant:

int callback_cancel(unsigned id)
{
   callback_t *p;
   int pi;

   p = gCallBackFirst;

   while (p)
   {
      if (p->id == id)
      {
         pi = p->pi;

         if (p->prev) {p->prev->next = p->next;}
         else         {gCallBackFirst = p->next;}

         if (p->next) {p->next->prev = p->prev;}
         else         {gCallBackLast = p->prev;}

         free(p);

         findNotifyBits(pi);

         return 0;
      }
      p = p->next;
   }
   return pigif_callback_not_found;
}